

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

QRect __thiscall QGridLayoutPrivate::cellRect(QGridLayoutPrivate *this,int row,int col)

{
  long lVar1;
  QRect QVar2;
  const_reference pQVar3;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  QList<QLayoutStruct> *rDataPtr;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar4;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_ESI < 0) || (*(int *)(in_RDI + 0xb0) <= in_ESI)) || (in_EDX < 0)) ||
     (*(int *)(in_RDI + 0xb4) <= in_EDX)) {
    QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  else {
    pQVar3 = QList<QLayoutStruct>::at
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    iVar4 = pQVar3->pos;
    QList<QLayoutStruct>::at
              ((QList<QLayoutStruct> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
               ,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    QList<QLayoutStruct>::at
              ((QList<QLayoutStruct> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
               ,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    QList<QLayoutStruct>::at
              ((QList<QLayoutStruct> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
               ,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    QRect::QRect((QRect *)CONCAT44(iVar4,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb4,
                 in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  QVar2.x2.m_i = (int)local_10;
  QVar2._0_8_ = local_18;
  QVar2.y2.m_i = (int)((ulong)local_10 >> 0x20);
  return QVar2;
}

Assistant:

QRect QGridLayoutPrivate::cellRect(int row, int col) const
{
    if (row < 0 || row >= rr || col < 0 || col >= cc)
        return QRect();

    const QList<QLayoutStruct> *rDataPtr;
    if (has_hfw && hfwData)
        rDataPtr = hfwData;
    else
        rDataPtr = &rowData;
    return QRect(colData.at(col).pos, rDataPtr->at(row).pos,
                 colData.at(col).size, rDataPtr->at(row).size);
}